

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_window_expression.cpp
# Opt level: O0

BindResult * __thiscall
duckdb::BaseSelectBinder::BindWindow(BaseSelectBinder *this,WindowExpression *window,idx_t depth)

{
  ExpressionClass EVar1;
  idx_t table;
  DBConfig *pDVar2;
  ExpressionType EVar3;
  bool bVar4;
  ExpressionType EVar5;
  type pFVar6;
  ScalarMacroCatalogEntry *pSVar7;
  undefined8 uVar8;
  size_type sVar9;
  pointer pEVar10;
  CatalogEntry *pCVar11;
  pointer pBVar12;
  pointer pBVar13;
  reference pvVar14;
  pointer pBVar15;
  BindResult *this_00;
  long in_RCX;
  BaseExpression *in_RDX;
  long *in_RSI;
  BindResult *in_RDI;
  templated_unique_single_t colref;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expression_1;
  OrderByNullType null_order_1;
  OrderType type_1;
  OrderByNode *order_5;
  iterator __end1_10;
  iterator __begin1_10;
  vector<duckdb::OrderByNode,_true> *__range1_10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expression;
  OrderByNullType null_order;
  OrderType type;
  OrderByNode *order_4;
  iterator __end1_9;
  iterator __begin1_9;
  vector<duckdb::OrderByNode,_true> *__range1_9;
  LogicalType order_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_order_3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *order_expr_3;
  char *range_name_3;
  char *range_name_2;
  LogicalType end_type;
  char *range_name_1;
  char *range_name;
  LogicalType start_type;
  OrderType range_sense;
  DBConfig *config;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_3
  ;
  iterator __end1_8;
  iterator __begin1_8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range1_8;
  templated_unique_single_t result;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  window_bound_aggregate;
  AggregateFunction bound_function;
  optional_idx best_function;
  FunctionBinder function_binder;
  ErrorData error_aggr;
  AggregateFunctionCatalogEntry *func;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_info;
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
  aggregate;
  LogicalType sql_type;
  size_type argno;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_2
  ;
  iterator __end1_7;
  iterator __begin1_7;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range1_7;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<duckdb::LogicalType,_true> types;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_order_2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *order_expr_2;
  OrderByNode *order_3;
  iterator __end1_6;
  iterator __begin1_6;
  vector<duckdb::OrderByNode,_true> *__range1_6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_partition;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *part_expr;
  iterator __end1_5;
  iterator __begin1_5;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range1_5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_order_1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *order_expr_1;
  OrderByNode *order_2;
  iterator __end1_4;
  iterator __begin1_4;
  vector<duckdb::OrderByNode,_true> *__range1_4;
  OrderByNode *order_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<duckdb::OrderByNode,_true> *__range1_3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> epoch;
  LogicalTypeId type_id;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_order;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *order_expr;
  OrderByNode *order;
  iterator __end1_2;
  iterator __begin1_2;
  vector<duckdb::OrderByNode,_true> *__range1_2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_1
  ;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range1_1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range1;
  ErrorData error;
  bool is_range;
  string name;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  macro_expr;
  templated_unique_single_t macro;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  EntryLookupInfo function_lookup;
  QueryErrorContext error_context;
  ClientContext *in_stack_fffffffffffff048;
  AggregateFunction *in_stack_fffffffffffff050;
  AggregateFunction *in_stack_fffffffffffff058;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  optional_idx in_stack_fffffffffffff060;
  ClientContext *in_stack_fffffffffffff068;
  LogicalTypeId id;
  optional_idx in_stack_fffffffffffff070;
  LogicalType *in_stack_fffffffffffff080;
  undefined4 in_stack_fffffffffffff088;
  date_t in_stack_fffffffffffff08c;
  WindowExcludeMode WVar16;
  ParsedExpression *in_stack_fffffffffffff090;
  undefined7 in_stack_fffffffffffff098;
  undefined1 in_stack_fffffffffffff09f;
  WindowBoundary WVar17;
  ErrorData *in_stack_fffffffffffff0a0;
  DBConfig *in_stack_fffffffffffff0a8;
  undefined7 in_stack_fffffffffffff0b0;
  undefined1 in_stack_fffffffffffff0b7;
  ClientContext *in_stack_fffffffffffff0b8;
  optional_idx in_stack_fffffffffffff0c0;
  FunctionBinder *in_stack_fffffffffffff0c8;
  ColumnBinding *args_2;
  LogicalType *args_1;
  ErrorData *in_stack_fffffffffffff0e8;
  LogicalType *in_stack_fffffffffffff0f0;
  ClientContext *in_stack_fffffffffffff0f8;
  ExpressionBinder *in_stack_fffffffffffff100;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_fffffffffffff118;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_fffffffffffff120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff128;
  undefined6 in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff136;
  undefined1 in_stack_fffffffffffff137;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff138;
  void **in_stack_fffffffffffff150;
  bool *in_stack_fffffffffffff158;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff180;
  undefined8 in_stack_fffffffffffff188;
  char *local_e50;
  char *local_e08;
  char *local_dc0;
  char *local_d78;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffff2d0;
  pointer in_stack_fffffffffffff2d8;
  string *in_stack_fffffffffffff2e0;
  undefined6 in_stack_fffffffffffff2e8;
  undefined1 in_stack_fffffffffffff2ee;
  ExpressionType in_stack_fffffffffffff2ef;
  bool local_b79;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_b28 [2];
  ColumnBinding local_b18 [3];
  ColumnBinding local_ae0 [4];
  OrderByNullType local_a9a;
  OrderType local_a99;
  reference local_a98;
  OrderByNode *local_a90;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  local_a88;
  optional_idx *local_a80;
  OrderByNullType local_a6a;
  OrderType local_a69;
  reference local_a68;
  OrderByNode *local_a60;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  local_a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_a50;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_9f0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_9e8;
  allocator local_9d9;
  string local_9d8 [56];
  char *local_9a0;
  allocator local_991;
  string local_990 [56];
  char *local_958;
  allocator local_931;
  string local_930 [56];
  char *local_8f8;
  allocator local_8e9;
  string local_8e8 [56];
  char *local_8b0;
  OrderType local_889;
  DBConfig *local_888;
  reference local_878;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_870;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_868;
  ExpressionType *local_860;
  ExpressionType local_851;
  allocator local_599;
  string local_598 [32];
  optional_idx local_578 [19];
  AggregateFunctionCatalogEntry *local_4e0;
  idx_t local_4d8;
  size_type local_458;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_450;
  reference local_448;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_440;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_438;
  undefined1 *local_430;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_428 [48];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_3f8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_3f0;
  reference local_3e8;
  OrderByNode *local_3e0;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_3d0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_3c8;
  reference local_3c0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_3b8;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_3b0;
  ExpressionType *local_3a8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_3a0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_398;
  reference local_390;
  OrderByNode *local_388;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  local_380;
  optional_idx *local_378;
  undefined4 local_36c;
  reference local_2e8;
  OrderByNode *local_2e0;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  local_2d8;
  optional_idx *local_2d0;
  allocator local_2c1;
  string local_2c0 [60];
  int32_t local_284;
  LogicalTypeId local_229;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_228;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_220;
  reference local_218;
  OrderByNode *local_210;
  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_200;
  reference local_1f8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_1f0;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_1e8;
  ExpressionType *local_1e0;
  reference local_1d8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_1d0;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_1c8;
  undefined1 *local_1c0;
  ErrorData local_1b8;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  idx_t local_110;
  bool local_103;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  idx_t local_e0;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  idx_t local_b0;
  string local_a8 [48];
  undefined1 local_78 [8];
  undefined8 local_70;
  CatalogEntry *local_60;
  idx_t local_58;
  idx_t local_30;
  optional_idx local_28;
  long local_20;
  BaseExpression *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = (idx_t)BaseExpression::GetQueryLocation(in_RDX);
  QueryErrorContext::QueryErrorContext((QueryErrorContext *)&local_28,(optional_idx)local_30);
  local_58 = local_28.index;
  EntryLookupInfo::EntryLookupInfo
            ((EntryLookupInfo *)in_stack_fffffffffffff058,
             (CatalogType)((ulong)in_stack_fffffffffffff050 >> 0x38),
             (string *)in_stack_fffffffffffff048,(QueryErrorContext)in_stack_fffffffffffff060.index)
  ;
  local_60 = (CatalogEntry *)
             ExpressionBinder::GetCatalogEntry
                       ((ExpressionBinder *)in_stack_fffffffffffff068,
                        (string *)in_stack_fffffffffffff060.index,
                        (string *)in_stack_fffffffffffff058,
                        (EntryLookupInfo *)in_stack_fffffffffffff050,
                        (OnEntryNotFound)((ulong)in_stack_fffffffffffff048 >> 0x38));
  EVar3 = BaseExpression::GetExpressionType(local_18);
  if (((EVar3 == WINDOW_AGGREGATE) &&
      (bVar4 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_60), bVar4)) &&
     (pCVar11 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                          ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_fffffffffffff050),
     pCVar11->type == MACRO_ENTRY)) {
    local_70 = 0;
    pCVar11 = (CatalogEntry *)&local_18[4].expression_class;
    make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,decltype(nullptr),bool&>
              (in_stack_fffffffffffff138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff137,
                        CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
               in_stack_fffffffffffff128,in_stack_fffffffffffff120,in_stack_fffffffffffff118,
               in_stack_fffffffffffff150,in_stack_fffffffffffff158);
    (*local_18->_vptr_BaseExpression[0xc])(local_78);
    pFVar6 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
             ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                          *)pCVar11);
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)pCVar11);
    pSVar7 = CatalogEntry::Cast<duckdb::ScalarMacroCatalogEntry>(pCVar11);
    (**(code **)(*in_RSI + 0x60))(in_RDI,in_RSI,pFVar6,pSVar7,local_20,local_78);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0xdac587);
    unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                 *)0xdac594);
  }
  else {
    ::std::__cxx11::string::string(local_a8,(string *)&local_18->alias);
    if ((*(byte *)(in_RSI + 0xd) & 1) != 0) {
      local_d2 = 1;
      uVar8 = __cxa_allocate_exception(0x10);
      local_b0 = local_28.index;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d0,"window function calls cannot be nested",&local_d1);
      BinderException::BinderException<>
                ((BinderException *)in_stack_fffffffffffff0b8,
                 (QueryErrorContext)in_stack_fffffffffffff0c0.index,
                 (string *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0));
      local_d2 = 0;
      __cxa_throw(uVar8,&BinderException::typeinfo,BinderException::~BinderException);
    }
    if (local_20 != 0) {
      local_102 = 1;
      uVar8 = __cxa_allocate_exception(0x10);
      local_e0 = local_28.index;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_100,"correlated columns in window functions not supported",&local_101);
      BinderException::BinderException<>
                ((BinderException *)in_stack_fffffffffffff0b8,
                 (QueryErrorContext)in_stack_fffffffffffff0c0.index,
                 (string *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0));
      local_102 = 0;
      __cxa_throw(uVar8,&BinderException::typeinfo,BinderException::~BinderException);
    }
    local_b79 = true;
    if (((local_18[4].field_0xa != '\a') && (local_b79 = true, local_18[4].field_0xa != '\b')) &&
       (local_b79 = true, local_18[4].field_0xb != '\a')) {
      local_b79 = local_18[4].field_0xb == '\b';
    }
    local_103 = local_b79;
    if ((local_b79 != false) &&
       (sVar9 = ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::size
                          ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                           &local_18[3].alias.field_2), sVar9 != 1)) {
      local_132 = 1;
      uVar8 = __cxa_allocate_exception(0x10);
      local_110 = local_28.index;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_130,"RANGE frames must have only one ORDER BY expression",&local_131);
      BinderException::BinderException<>
                ((BinderException *)in_stack_fffffffffffff0b8,
                 (QueryErrorContext)in_stack_fffffffffffff0c0.index,
                 (string *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0));
      local_132 = 0;
      __cxa_throw(uVar8,&BinderException::typeinfo,BinderException::~BinderException);
    }
    *(undefined1 *)(in_RSI + 0xd) = 1;
    ErrorData::ErrorData((ErrorData *)in_stack_fffffffffffff050);
    local_1c0 = (undefined1 *)((long)&local_18[2].alias.field_2 + 8);
    local_1c8._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffff048);
    local_1d0 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)::std::
                   vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          *)in_stack_fffffffffffff048);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffff050,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffff048), bVar4) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                  ::operator*(&local_1c8);
      ExpressionBinder::BindChild
                (in_stack_fffffffffffff100,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
                 in_stack_fffffffffffff0e8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&local_1c8);
    }
    local_1e0 = &local_18[3].type;
    local_1e8._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffff048);
    local_1f0 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)::std::
                   vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          *)in_stack_fffffffffffff048);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffff050,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffff048), bVar4) {
      local_1f8 = __gnu_cxx::
                  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                  ::operator*(&local_1e8);
      ExpressionBinder::BindChild
                (in_stack_fffffffffffff100,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
                 in_stack_fffffffffffff0e8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&local_1e8);
    }
    local_200 = &local_18[3].alias.field_2;
    local_208._M_current =
         (OrderByNode *)
         ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                   ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                    in_stack_fffffffffffff048);
    local_210 = (OrderByNode *)
                ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                          ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                           in_stack_fffffffffffff048);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffff050,
                              (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffff048), bVar4) {
      local_218 = __gnu_cxx::
                  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                  ::operator*(&local_208);
      ExpressionBinder::BindChild
                (in_stack_fffffffffffff100,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
                 in_stack_fffffffffffff0e8);
      if (((local_103 & 1U) != 0) && (bVar4 = ErrorData::HasError(&local_1b8), !bVar4)) {
        local_220 = &local_218->expression;
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_fffffffffffff050);
        local_228 = BoundExpression::GetExpression(in_stack_fffffffffffff090);
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)in_stack_fffffffffffff050);
        local_229 = LogicalType::id(&pEVar10->return_type);
        if ((local_229 == TIME) || (local_229 == TIME_TZ)) {
          local_284 = (int32_t)date_t::epoch();
          Value::DATE(in_stack_fffffffffffff08c);
          make_uniq<duckdb::ConstantExpression,duckdb::Value>((Value *)in_stack_fffffffffffff0b8);
          unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
          unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
                    ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)in_stack_fffffffffffff050,
                     (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                      *)in_stack_fffffffffffff048);
          unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
          ::~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                         *)0xdacd62);
          Value::~Value((Value *)in_stack_fffffffffffff050);
          ExpressionBinder::BindChild
                    (in_stack_fffffffffffff100,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
                     in_stack_fffffffffffff0e8);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2c0,"+",&local_2c1);
          BindRangeExpression((ClientContext *)
                              CONCAT17(in_stack_fffffffffffff2ef,
                                       CONCAT16(in_stack_fffffffffffff2ee,in_stack_fffffffffffff2e8)
                                      ),in_stack_fffffffffffff2e0,
                              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)in_stack_fffffffffffff2d8,
                              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)in_stack_fffffffffffff2d0);
          LogicalType::~LogicalType((LogicalType *)0xdace1d);
          ::std::__cxx11::string::~string(local_2c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          ::~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)0xdace44);
        }
      }
      __gnu_cxx::
      __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
      ::operator++(&local_208);
    }
    ExpressionBinder::BindChild
              (in_stack_fffffffffffff100,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0e8);
    ExpressionBinder::BindChild
              (in_stack_fffffffffffff100,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0e8);
    ExpressionBinder::BindChild
              (in_stack_fffffffffffff100,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0e8);
    ExpressionBinder::BindChild
              (in_stack_fffffffffffff100,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0e8);
    ExpressionBinder::BindChild
              (in_stack_fffffffffffff100,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0e8);
    local_2d0 = &local_18[4].query_location;
    local_2d8._M_current =
         (OrderByNode *)
         ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                   ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                    in_stack_fffffffffffff048);
    local_2e0 = (OrderByNode *)
                ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                          ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                           in_stack_fffffffffffff048);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffff050,
                              (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                               *)in_stack_fffffffffffff048), bVar4) {
      local_2e8 = __gnu_cxx::
                  __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                  ::operator*(&local_2d8);
      ExpressionBinder::BindChild
                (in_stack_fffffffffffff100,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffff0f8,(idx_t)in_stack_fffffffffffff0f0,
                 in_stack_fffffffffffff0e8);
      __gnu_cxx::
      __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
      ::operator++(&local_2d8);
    }
    *(undefined1 *)(in_RSI + 0xd) = 0;
    bVar4 = ErrorData::HasError(&local_1b8);
    if (bVar4) {
      ErrorData::ErrorData
                ((ErrorData *)in_stack_fffffffffffff050,(ErrorData *)in_stack_fffffffffffff048);
      BindResult::BindResult
                ((BindResult *)in_stack_fffffffffffff060.index,
                 (ErrorData *)in_stack_fffffffffffff058);
      ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff050);
      local_36c = 1;
    }
    else {
      local_378 = &local_18[4].query_location;
      local_380._M_current =
           (OrderByNode *)
           ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                     ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                      in_stack_fffffffffffff048);
      local_388 = (OrderByNode *)
                  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                            ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                             in_stack_fffffffffffff048);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff050,
                                (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff048), bVar4) {
        local_390 = __gnu_cxx::
                    __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                    ::operator*(&local_380);
        local_398 = &local_390->expression;
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_fffffffffffff050);
        local_3a0 = BoundExpression::GetExpression(in_stack_fffffffffffff090);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050);
        ExpressionBinder::PushCollation
                  ((ClientContext *)in_stack_fffffffffffff060.index,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff058,(LogicalType *)in_stack_fffffffffffff050,
                   (CollationType)((ulong)in_stack_fffffffffffff048 >> 0x20));
        __gnu_cxx::
        __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
        ::operator++(&local_380);
      }
      local_3a8 = &local_18[3].type;
      local_3b0._M_current =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)in_stack_fffffffffffff048);
      local_3b8 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)::std::
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            *)in_stack_fffffffffffff048);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                                 *)in_stack_fffffffffffff050,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                                 *)in_stack_fffffffffffff048), bVar4) {
        local_3c0 = __gnu_cxx::
                    __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                    ::operator*(&local_3b0);
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_fffffffffffff050);
        local_3c8 = BoundExpression::GetExpression(in_stack_fffffffffffff090);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050);
        ExpressionBinder::PushCollation
                  ((ClientContext *)in_stack_fffffffffffff060.index,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff058,(LogicalType *)in_stack_fffffffffffff050,
                   (CollationType)((ulong)in_stack_fffffffffffff048 >> 0x20));
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
        ::operator++(&local_3b0);
      }
      local_3d0 = &local_18[3].alias.field_2;
      local_3d8._M_current =
           (OrderByNode *)
           ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                     ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                      in_stack_fffffffffffff048);
      local_3e0 = (OrderByNode *)
                  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                            ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                             in_stack_fffffffffffff048);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff050,
                                (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff048), bVar4) {
        local_3e8 = __gnu_cxx::
                    __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                    ::operator*(&local_3d8);
        local_3f0 = &local_3e8->expression;
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_fffffffffffff050);
        local_3f8 = BoundExpression::GetExpression(in_stack_fffffffffffff090);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050);
        ExpressionBinder::PushCollation
                  ((ClientContext *)in_stack_fffffffffffff060.index,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff058,(LogicalType *)in_stack_fffffffffffff050,
                   (CollationType)((ulong)in_stack_fffffffffffff048 >> 0x20));
        __gnu_cxx::
        __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
        ::operator++(&local_3d8);
      }
      vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xdad4b3);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)0xdad4c0);
      local_430 = (undefined1 *)((long)&local_18[2].alias.field_2 + 8);
      local_438._M_current =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)in_stack_fffffffffffff048);
      local_440 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)::std::
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            *)in_stack_fffffffffffff048);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                            *)in_stack_fffffffffffff050,
                           (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                            *)in_stack_fffffffffffff048);
        EVar3 = (ExpressionType)((ulong)in_stack_fffffffffffff188 >> 0x38);
        if (!bVar4) break;
        local_448 = __gnu_cxx::
                    __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                    ::operator*(&local_438);
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_fffffffffffff050);
        local_450 = BoundExpression::GetExpression(in_stack_fffffffffffff090);
        local_458 = ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ::size(local_428);
        EVar3 = BaseExpression::GetExpressionType(local_18);
        if (EVar3 == WINDOW_NTH_VALUE) {
          if (local_458 == 1) {
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff050,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff048);
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_fffffffffffff070.index,
                       (LogicalTypeId)((ulong)in_stack_fffffffffffff068 >> 0x38));
            BoundCastExpression::AddCastToType
                      (in_stack_fffffffffffff0b8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
                       (LogicalType *)in_stack_fffffffffffff0a8,
                       SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff050,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff048);
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)0xdad770);
            LogicalType::~LogicalType((LogicalType *)0xdad77d);
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)0xdad78a);
          }
        }
        else if ((EVar3 == WINDOW_NTILE) && (local_458 == 0)) {
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff050,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff048);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff070.index,
                     (LogicalTypeId)((ulong)in_stack_fffffffffffff068 >> 0x38));
          BoundCastExpression::AddCastToType
                    (in_stack_fffffffffffff0b8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
                     (LogicalType *)in_stack_fffffffffffff0a8,
                     SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff050,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff048);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xdad66e);
          LogicalType::~LogicalType((LogicalType *)0xdad67b);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xdad688);
        }
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   in_stack_fffffffffffff060.index,(value_type *)in_stack_fffffffffffff058);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)in_stack_fffffffffffff050,(value_type *)in_stack_fffffffffffff048);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
        ::operator++(&local_438);
      }
      LogicalType::LogicalType((LogicalType *)0xdad843);
      unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>::
      unique_ptr((unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                  *)0xdad852);
      unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::unique_ptr
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)0xdad85f);
      EVar5 = BaseExpression::GetExpressionType(local_18);
      if (EVar5 == WINDOW_AGGREGATE) {
        bVar4 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_60);
        if ((!bVar4) ||
           (pCVar11 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                                ((optional_ptr<duckdb::CatalogEntry,_true> *)
                                 in_stack_fffffffffffff050),
           pCVar11->type != AGGREGATE_FUNCTION_ENTRY)) {
          local_4d8 = local_28.index;
          Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                    (in_stack_fffffffffffff068,(string *)in_stack_fffffffffffff060.index,
                     (string *)in_stack_fffffffffffff058,(string *)in_stack_fffffffffffff050,
                     (QueryErrorContext)in_stack_fffffffffffff070.index);
        }
        optional_ptr<duckdb::CatalogEntry,_true>::operator->
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_fffffffffffff050);
        local_4e0 = CatalogEntry::Cast<duckdb::AggregateFunctionCatalogEntry>
                              ((CatalogEntry *)in_stack_fffffffffffff050);
        ErrorData::ErrorData((ErrorData *)in_stack_fffffffffffff050);
        FunctionBinder::FunctionBinder
                  ((FunctionBinder *)in_stack_fffffffffffff050,in_stack_fffffffffffff048);
        local_578[0] = FunctionBinder::BindFunction
                                 ((FunctionBinder *)in_stack_fffffffffffff068,
                                  in_stack_fffffffffffff060.index,
                                  (AggregateFunctionSet *)in_stack_fffffffffffff058,
                                  (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff050,
                                  (ErrorData *)in_stack_fffffffffffff048);
        bVar4 = optional_idx::IsValid(local_578);
        if (!bVar4) {
          ErrorData::AddQueryLocation
                    ((ErrorData *)in_stack_fffffffffffff060.index,
                     (ParsedExpression *)in_stack_fffffffffffff058);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_598,anon_var_dwarf_3eb64fd + 9,&local_599);
          ErrorData::Throw(in_stack_fffffffffffff0a0,
                           (string *)CONCAT17(in_stack_fffffffffffff09f,in_stack_fffffffffffff098));
        }
        optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffff090);
        FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                  ((FunctionSet<duckdb::AggregateFunction> *)in_stack_fffffffffffff058,
                   (idx_t)in_stack_fffffffffffff050);
        AggregateFunction::AggregateFunction
                  ((AggregateFunction *)in_stack_fffffffffffff060.index,in_stack_fffffffffffff058);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffff050,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffff048);
        unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
        unique_ptr<std::default_delete<duckdb::Expression>,void>
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050,in_stack_fffffffffffff048);
        FunctionBinder::BindAggregateFunction
                  (in_stack_fffffffffffff0c8,(AggregateFunction *)in_stack_fffffffffffff0c0.index,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffff0b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
                   (AggregateType)((ulong)in_stack_fffffffffffff0a8 >> 0x38));
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xdadba6);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)0xdadbb3);
        AggregateFunction::~AggregateFunction(in_stack_fffffffffffff050);
        unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
        ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)in_stack_fffffffffffff050);
        make_uniq<duckdb::AggregateFunction,duckdb::AggregateFunction&>
                  ((AggregateFunction *)in_stack_fffffffffffff068);
        unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
        ::operator=((unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                     *)in_stack_fffffffffffff050,
                    (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                     *)in_stack_fffffffffffff048);
        unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
        ::~unique_ptr((unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                       *)0xdadc1c);
        unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
        ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)in_stack_fffffffffffff050);
        unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator=
                  ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)in_stack_fffffffffffff050,
                   (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)in_stack_fffffffffffff048);
        unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
        ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)in_stack_fffffffffffff050);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator=((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     *)in_stack_fffffffffffff050,
                    (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     *)in_stack_fffffffffffff048);
        unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
        ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)in_stack_fffffffffffff050);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff058,(LogicalType *)in_stack_fffffffffffff050
                  );
        unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
        ::~unique_ptr((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                       *)0xdadcc1);
        AggregateFunction::~AggregateFunction(in_stack_fffffffffffff050);
        ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff050);
      }
      else {
        in_stack_fffffffffffff2ef = BaseExpression::GetExpressionType(local_18);
        ResolveWindowExpressionType(EVar3,in_stack_fffffffffffff180);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff050,(LogicalType *)in_stack_fffffffffffff048
                  );
        LogicalType::~LogicalType((LogicalType *)0xdaddcc);
      }
      EVar3 = BaseExpression::GetExpressionType(local_18);
      local_851 = EVar3;
      make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::AggregateFunction,std::default_delete<duckdb::AggregateFunction>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
                ((ExpressionType *)in_stack_fffffffffffff0c8,
                 (LogicalType *)in_stack_fffffffffffff0c0.index,
                 (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                  *)in_stack_fffffffffffff0b8,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0));
      pBVar12 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator=((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)in_stack_fffffffffffff050,
                  (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)in_stack_fffffffffffff048);
      local_860 = &local_18[3].type;
      local_868._M_current =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)in_stack_fffffffffffff048);
      local_870 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)::std::
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            *)in_stack_fffffffffffff048);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                                 *)in_stack_fffffffffffff050,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                                 *)in_stack_fffffffffffff048), bVar4) {
        local_878 = __gnu_cxx::
                    __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                    ::operator*(&local_868);
        in_stack_fffffffffffff2d8 =
             unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)in_stack_fffffffffffff050);
        in_stack_fffffffffffff2d0 = &in_stack_fffffffffffff2d8->partitions;
        GetExpression((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)in_stack_fffffffffffff058);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)in_stack_fffffffffffff050,(value_type *)in_stack_fffffffffffff048);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xdadf28);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
        ::operator++(&local_868);
      }
      EVar5 = local_18[4].type;
      pBVar13 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      pBVar13->ignore_nulls = (bool)(EVar5 & 1);
      EVar1 = local_18[4].expression_class;
      pBVar13 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      pBVar13->distinct = (bool)(EVar1 & AGGREGATE);
      local_888 = DBConfig::GetConfig((ClientContext *)0xdae012);
      local_889 = INVALID;
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff070.index,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffff068 >> 0x38));
      pDVar2 = local_888;
      if (local_18[4].field_0xa == '\a') {
        pvVar14 = vector<duckdb::OrderByNode,_true>::operator[]
                            ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                             (size_type)in_stack_fffffffffffff048);
        local_889 = DBConfig::ResolveOrder(pDVar2,pvVar14->type);
        if (local_889 == ASCENDING) {
          local_d78 = "U\x04-";
        }
        else {
          local_d78 = "U\x04+";
        }
        local_d78 = local_d78 + 2;
        local_8b0 = local_d78;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_8e8,local_d78,&local_8e9);
        vector<duckdb::OrderByNode,_true>::operator[]
                  ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                   (size_type)in_stack_fffffffffffff048);
        BindRangeExpression((ClientContext *)
                            CONCAT17(in_stack_fffffffffffff2ef,
                                     CONCAT16(EVar3,in_stack_fffffffffffff2e8)),(string *)pBVar12,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d8,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d0);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff050,(LogicalType *)in_stack_fffffffffffff048
                  );
        LogicalType::~LogicalType((LogicalType *)0xdae1da);
        ::std::__cxx11::string::~string(local_8e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
      }
      else if (local_18[4].field_0xa == '\b') {
        pvVar14 = vector<duckdb::OrderByNode,_true>::operator[]
                            ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                             (size_type)in_stack_fffffffffffff048);
        local_889 = DBConfig::ResolveOrder(pDVar2,pvVar14->type);
        if (local_889 == ASCENDING) {
          local_dc0 = "U\x04+";
        }
        else {
          local_dc0 = "U\x04-";
        }
        local_dc0 = local_dc0 + 2;
        local_8f8 = local_dc0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_930,local_dc0,&local_931);
        vector<duckdb::OrderByNode,_true>::operator[]
                  ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                   (size_type)in_stack_fffffffffffff048);
        BindRangeExpression((ClientContext *)
                            CONCAT17(in_stack_fffffffffffff2ef,
                                     CONCAT16(EVar3,in_stack_fffffffffffff2e8)),(string *)pBVar12,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d8,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d0);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff050,(LogicalType *)in_stack_fffffffffffff048
                  );
        LogicalType::~LogicalType((LogicalType *)0xdae3ed);
        ::std::__cxx11::string::~string(local_930);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_931);
      }
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff070.index,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffff068 >> 0x38));
      pDVar2 = local_888;
      if (local_18[4].field_0xb == '\a') {
        pvVar14 = vector<duckdb::OrderByNode,_true>::operator[]
                            ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                             (size_type)in_stack_fffffffffffff048);
        local_889 = DBConfig::ResolveOrder(pDVar2,pvVar14->type);
        if (local_889 == ASCENDING) {
          local_e08 = "U\x04-";
        }
        else {
          local_e08 = "U\x04+";
        }
        local_e08 = local_e08 + 2;
        local_958 = local_e08;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_990,local_e08,&local_991);
        vector<duckdb::OrderByNode,_true>::operator[]
                  ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                   (size_type)in_stack_fffffffffffff048);
        BindRangeExpression((ClientContext *)
                            CONCAT17(in_stack_fffffffffffff2ef,
                                     CONCAT16(EVar3,in_stack_fffffffffffff2e8)),(string *)pBVar12,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d8,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d0);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff050,(LogicalType *)in_stack_fffffffffffff048
                  );
        LogicalType::~LogicalType((LogicalType *)0xdae5fa);
        ::std::__cxx11::string::~string(local_990);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_991);
      }
      else if (local_18[4].field_0xb == '\b') {
        pvVar14 = vector<duckdb::OrderByNode,_true>::operator[]
                            ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                             (size_type)in_stack_fffffffffffff048);
        local_889 = DBConfig::ResolveOrder(pDVar2,pvVar14->type);
        if (local_889 == ASCENDING) {
          local_e50 = "U\x04+";
        }
        else {
          local_e50 = "U\x04-";
        }
        local_e50 = local_e50 + 2;
        local_9a0 = local_e50;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_9d8,local_e50,&local_9d9);
        vector<duckdb::OrderByNode,_true>::operator[]
                  ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                   (size_type)in_stack_fffffffffffff048);
        BindRangeExpression((ClientContext *)
                            CONCAT17(in_stack_fffffffffffff2ef,
                                     CONCAT16(EVar3,in_stack_fffffffffffff2e8)),(string *)pBVar12,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d8,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff2d0);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff050,(LogicalType *)in_stack_fffffffffffff048
                  );
        LogicalType::~LogicalType((LogicalType *)0xdae80d);
        ::std::__cxx11::string::~string(local_9d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
      }
      if (local_889 != INVALID) {
        pvVar14 = vector<duckdb::OrderByNode,_true>::operator[]
                            ((vector<duckdb::OrderByNode,_true> *)in_stack_fffffffffffff050,
                             (size_type)in_stack_fffffffffffff048);
        local_9e8 = &pvVar14->expression;
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_fffffffffffff050);
        local_9f0 = BoundExpression::GetExpression(in_stack_fffffffffffff090);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050);
        LogicalType::LogicalType
                  ((LogicalType *)in_stack_fffffffffffff050,(LogicalType *)in_stack_fffffffffffff048
                  );
        bVar4 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            *)0xdae93c);
        if (bVar4) {
          LogicalType::MaxLogicalType
                    (in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f0,
                     (LogicalType *)in_stack_fffffffffffff0e8);
          LogicalType::operator=
                    ((LogicalType *)in_stack_fffffffffffff050,
                     (LogicalType *)in_stack_fffffffffffff048);
          LogicalType::~LogicalType((LogicalType *)0xdae98f);
        }
        bVar4 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            *)0xdae9be);
        if (bVar4) {
          LogicalType::MaxLogicalType
                    (in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f0,
                     (LogicalType *)in_stack_fffffffffffff0e8);
          LogicalType::operator=
                    ((LogicalType *)in_stack_fffffffffffff050,
                     (LogicalType *)in_stack_fffffffffffff048);
          LogicalType::~LogicalType((LogicalType *)0xdaea11);
        }
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff048);
        BoundCastExpression::AddCastToType
                  (in_stack_fffffffffffff0b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
                   (LogicalType *)in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff050,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff048);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xdaea96);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xdaeaa3);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff058,(LogicalType *)in_stack_fffffffffffff050
                  );
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffff058,(LogicalType *)in_stack_fffffffffffff050
                  );
        LogicalType::~LogicalType((LogicalType *)0xdaeae6);
      }
      local_a50 = &local_18[3].alias.field_2;
      local_a58._M_current =
           (OrderByNode *)
           ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                     ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                      in_stack_fffffffffffff048);
      local_a60 = (OrderByNode *)
                  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                            ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                             in_stack_fffffffffffff048);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff050,
                                (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff048), bVar4) {
        local_a68 = __gnu_cxx::
                    __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                    ::operator*(&local_a58);
        local_a69 = DBConfig::ResolveOrder(local_888,local_a68->type);
        local_a6a = DBConfig::ResolveNullOrder
                              (in_stack_fffffffffffff0a8,
                               (OrderType)((ulong)in_stack_fffffffffffff0a0 >> 0x38),
                               (OrderByNullType)((ulong)in_stack_fffffffffffff0a0 >> 0x30));
        GetExpression((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)in_stack_fffffffffffff058);
        unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
        ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                      *)in_stack_fffffffffffff050);
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   in_stack_fffffffffffff070.index,(OrderType *)in_stack_fffffffffffff068,
                   (OrderByNullType *)in_stack_fffffffffffff060.index,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff058);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xdaec62);
        __gnu_cxx::
        __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
        ::operator++(&local_a58);
      }
      local_a80 = &local_18[4].query_location;
      local_a88._M_current =
           (OrderByNode *)
           ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::begin
                     ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                      in_stack_fffffffffffff048);
      local_a90 = (OrderByNode *)
                  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::end
                            ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                             in_stack_fffffffffffff048);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff050,
                                (__normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                                 *)in_stack_fffffffffffff048), bVar4) {
        local_a98 = __gnu_cxx::
                    __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
                    ::operator*(&local_a88);
        local_a99 = DBConfig::ResolveOrder(local_888,local_a98->type);
        local_a9a = DBConfig::ResolveNullOrder
                              (in_stack_fffffffffffff0a8,
                               (OrderType)((ulong)in_stack_fffffffffffff0a0 >> 0x38),
                               (OrderByNullType)((ulong)in_stack_fffffffffffff0a0 >> 0x30));
        GetExpression((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)in_stack_fffffffffffff058);
        unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
        ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                      *)in_stack_fffffffffffff050);
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   in_stack_fffffffffffff070.index,(OrderType *)in_stack_fffffffffffff068,
                   (OrderByNullType *)in_stack_fffffffffffff060.index,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff058);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xdaede1);
        __gnu_cxx::
        __normal_iterator<duckdb::OrderByNode_*,_std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>_>
        ::operator++(&local_a88);
      }
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff070.index,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffff068 >> 0x38));
      id = (LogicalTypeId)((ulong)in_stack_fffffffffffff068 >> 0x38);
      CastWindowExpression
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)CONCAT44(in_stack_fffffffffffff08c.days,in_stack_fffffffffffff088),
                 in_stack_fffffffffffff080);
      unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
      ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    *)in_stack_fffffffffffff050);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff048);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaeeaa);
      LogicalType::~LogicalType((LogicalType *)0xdaeeb7);
      CastWindowExpression
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)CONCAT44(in_stack_fffffffffffff08c.days,in_stack_fffffffffffff088),
                 in_stack_fffffffffffff080);
      unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
      ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    *)in_stack_fffffffffffff050);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff048);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaef25);
      CastWindowExpression
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)CONCAT44(in_stack_fffffffffffff08c.days,in_stack_fffffffffffff088),
                 in_stack_fffffffffffff080);
      unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
      ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    *)in_stack_fffffffffffff050);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff048);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaef93);
      LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffff070.index,id);
      CastWindowExpression
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)CONCAT44(in_stack_fffffffffffff08c.days,in_stack_fffffffffffff088),
                 in_stack_fffffffffffff080);
      unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
      ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    *)in_stack_fffffffffffff050);
      args_2 = local_ae0;
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff048);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaf024);
      LogicalType::~LogicalType((LogicalType *)0xdaf031);
      args_1 = (LogicalType *)((long)&local_18[4].alias.field_2 + 8);
      pBVar12 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      CastWindowExpression
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)CONCAT44(in_stack_fffffffffffff08c.days,in_stack_fffffffffffff088),
                 in_stack_fffffffffffff080);
      pBVar13 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff048);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaf0bd);
      WVar17 = local_18[4].field_0xa;
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      pBVar15->start = WVar17;
      WVar17 = local_18[4].field_0xb;
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      pBVar15->end = WVar17;
      WVar16 = local_18[4].field_0xc;
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)in_stack_fffffffffffff050);
      pBVar15->exclude_clause = WVar16;
      unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
      ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    *)in_stack_fffffffffffff050);
      table = *(idx_t *)(in_RSI[0xe] + 0x2b0);
      sVar9 = ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)(in_RSI[0xe] + 0x2b8));
      ColumnBinding::ColumnBinding(local_b18,table,sVar9);
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar12,args_1
                 ,args_2,(unsigned_long *)pBVar13);
      this_00 = (BindResult *)(in_RSI[0xe] + 0x2b8);
      unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
      unique_ptr<duckdb::BoundWindowExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
                  *)in_stack_fffffffffffff048);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)in_stack_fffffffffffff050,(value_type *)in_stack_fffffffffffff048);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaf234);
      expr = local_b28;
      unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
      unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff050,
                 (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                  *)in_stack_fffffffffffff048);
      BindResult::BindResult(this_00,expr);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdaf26f);
      local_36c = 1;
      unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                     *)0xdaf287);
      LogicalType::~LogicalType((LogicalType *)0xdaf294);
      LogicalType::~LogicalType((LogicalType *)0xdaf2a1);
      unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                     *)0xdaf2ae);
      unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)0xdaf2bb);
      unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>::
      ~unique_ptr((unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                   *)0xdaf2c8);
      LogicalType::~LogicalType((LogicalType *)0xdaf2d5);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 *)0xdaf2e2);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdaf2ef);
    }
    ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff050);
    ::std::__cxx11::string::~string(local_a8);
  }
  return in_RDI;
}

Assistant:

BindResult BaseSelectBinder::BindWindow(WindowExpression &window, idx_t depth) {
	QueryErrorContext error_context(window.GetQueryLocation());
	//	Check for macros pretending to be aggregates

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, window.function_name, error_context);
	auto entry = GetCatalogEntry(window.catalog, window.schema, function_lookup, OnEntryNotFound::RETURN_NULL);
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE && entry &&
	    entry->type == CatalogType::MACRO_ENTRY) {
		auto macro = make_uniq<FunctionExpression>(window.catalog, window.schema, window.function_name,
		                                           std::move(window.children), std::move(window.filter_expr), nullptr,
		                                           window.distinct);
		auto macro_expr = window.Copy();
		return BindMacro(*macro, entry->Cast<ScalarMacroCatalogEntry>(), depth, macro_expr);
	}

	auto name = window.alias;

	if (inside_window) {
		throw BinderException(error_context, "window function calls cannot be nested");
	}
	if (depth > 0) {
		throw BinderException(error_context, "correlated columns in window functions not supported");
	}

	// If we have range expressions, then only one order by clause is allowed.
	const auto is_range =
	    (window.start == WindowBoundary::EXPR_PRECEDING_RANGE || window.start == WindowBoundary::EXPR_FOLLOWING_RANGE ||
	     window.end == WindowBoundary::EXPR_PRECEDING_RANGE || window.end == WindowBoundary::EXPR_FOLLOWING_RANGE);
	if (is_range && window.orders.size() != 1) {
		throw BinderException(error_context, "RANGE frames must have only one ORDER BY expression");
	}
	// bind inside the children of the window function
	// we set the inside_window flag to true to prevent binding nested window functions
	inside_window = true;
	ErrorData error;
	for (auto &child : window.children) {
		BindChild(child, depth, error);
	}
	for (auto &child : window.partitions) {
		BindChild(child, depth, error);
	}
	for (auto &order : window.orders) {
		BindChild(order.expression, depth, error);

		//	If the frame is a RANGE frame and the type is a time,
		//	then we have to convert the time to a timestamp to avoid wrapping.
		if (!is_range || error.HasError()) {
			continue;
		}
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		const auto type_id = bound_order->return_type.id();
		if (type_id == LogicalTypeId::TIME || type_id == LogicalTypeId::TIME_TZ) {
			//	Convert to time + epoch and rebind
			unique_ptr<ParsedExpression> epoch = make_uniq<ConstantExpression>(Value::DATE(date_t::epoch()));
			BindChild(epoch, depth, error);
			BindRangeExpression(context, "+", order.expression, epoch);
		}
	}
	BindChild(window.filter_expr, depth, error);
	BindChild(window.start_expr, depth, error);
	BindChild(window.end_expr, depth, error);
	BindChild(window.offset_expr, depth, error);
	BindChild(window.default_expr, depth, error);

	for (auto &order : window.arg_orders) {
		BindChild(order.expression, depth, error);
	}

	inside_window = false;
	if (error.HasError()) {
		// failed to bind children of window function
		return BindResult(std::move(error));
	}

	//	Restore any collation expressions
	for (auto &order : window.arg_orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	for (auto &part_expr : window.partitions) {
		auto &bound_partition = BoundExpression::GetExpression(*part_expr);
		ExpressionBinder::PushCollation(context, bound_partition, bound_partition->return_type);
	}
	for (auto &order : window.orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	// successfully bound all children: create bound window function
	vector<LogicalType> types;
	vector<unique_ptr<Expression>> children;
	for (auto &child : window.children) {
		D_ASSERT(child.get());
		D_ASSERT(child->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound = BoundExpression::GetExpression(*child);
		// Add casts for positional arguments
		const auto argno = children.size();
		switch (window.GetExpressionType()) {
		case ExpressionType::WINDOW_NTILE:
			// ntile(bigint)
			if (argno == 0) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		case ExpressionType::WINDOW_NTH_VALUE:
			// nth_value(<expr>, index)
			if (argno == 1) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		default:
			break;
		}
		types.push_back(bound->return_type);
		children.push_back(std::move(bound));
	}
	//  Determine the function type.
	LogicalType sql_type;
	unique_ptr<AggregateFunction> aggregate;
	unique_ptr<FunctionData> bind_info;
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE) {
		//  Look up the aggregate function in the catalog
		if (!entry || entry->type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			//	Not an aggregate: Look it up to generate error
			Catalog::GetEntry<AggregateFunctionCatalogEntry>(context, window.catalog, window.schema,
			                                                 window.function_name, error_context);
		}
		auto &func = entry->Cast<AggregateFunctionCatalogEntry>();
		D_ASSERT(func.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);

		// bind the aggregate
		ErrorData error_aggr;
		FunctionBinder function_binder(context);
		auto best_function = function_binder.BindFunction(func.name, func.functions, types, error_aggr);
		if (!best_function.IsValid()) {
			error_aggr.AddQueryLocation(window);
			error_aggr.Throw();
		}

		// found a matching function! bind it as an aggregate
		auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());
		auto window_bound_aggregate = function_binder.BindAggregateFunction(bound_function, std::move(children));
		// create the aggregate
		aggregate = make_uniq<AggregateFunction>(window_bound_aggregate->function);
		bind_info = std::move(window_bound_aggregate->bind_info);
		children = std::move(window_bound_aggregate->children);
		sql_type = window_bound_aggregate->return_type;

	} else {
		// fetch the child of the non-aggregate window function (if any)
		sql_type = ResolveWindowExpressionType(window.GetExpressionType(), types);
	}
	auto result = make_uniq<BoundWindowExpression>(window.GetExpressionType(), sql_type, std::move(aggregate),
	                                               std::move(bind_info));
	result->children = std::move(children);
	for (auto &child : window.partitions) {
		result->partitions.push_back(GetExpression(child));
	}
	result->ignore_nulls = window.ignore_nulls;
	result->distinct = window.distinct;

	// Convert RANGE boundary expressions to ORDER +/- expressions.
	// Note that PRECEEDING and FOLLOWING refer to the sequential order in the frame,
	// not the natural ordering of the type. This means that the offset arithmetic must be reversed
	// for ORDER BY DESC.
	auto &config = DBConfig::GetConfig(context);
	auto range_sense = OrderType::INVALID;
	LogicalType start_type = LogicalType::BIGINT;
	if (window.start == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);

	} else if (window.start == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);
	}

	LogicalType end_type = LogicalType::BIGINT;
	if (window.end == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);

	} else if (window.end == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);
	}

	// Cast ORDER and boundary expressions to the same type
	if (range_sense != OrderType::INVALID) {
		D_ASSERT(window.orders.size() == 1);

		auto &order_expr = window.orders[0].expression;
		D_ASSERT(order_expr.get());
		D_ASSERT(order_expr->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		auto order_type = bound_order->return_type;
		if (window.start_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, start_type);
		}
		if (window.end_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, end_type);
		}

		// Cast all three to match
		bound_order = BoundCastExpression::AddCastToType(context, std::move(bound_order), order_type);
		start_type = end_type = order_type;
	}

	for (auto &order : window.orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->orders.emplace_back(type, null_order, std::move(expression));
	}

	// Argument orders are just like arguments, not frames
	for (auto &order : window.arg_orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->arg_orders.emplace_back(type, null_order, std::move(expression));
	}

	result->filter_expr = CastWindowExpression(window.filter_expr, LogicalType::BOOLEAN);
	result->start_expr = CastWindowExpression(window.start_expr, start_type);
	result->end_expr = CastWindowExpression(window.end_expr, end_type);
	result->offset_expr = CastWindowExpression(window.offset_expr, LogicalType::BIGINT);
	result->default_expr = CastWindowExpression(window.default_expr, result->return_type);
	result->start = window.start;
	result->end = window.end;
	result->exclude_clause = window.exclude_clause;

	// create a BoundColumnRef that references this entry
	auto colref = make_uniq<BoundColumnRefExpression>(std::move(name), result->return_type,
	                                                  ColumnBinding(node.window_index, node.windows.size()), depth);
	// move the WINDOW expression into the set of bound windows
	node.windows.push_back(std::move(result));
	return BindResult(std::move(colref));
}